

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O0

int SendBreakPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,int mode,int breakduration)

{
  int iVar1;
  size_t sVar2;
  char *softbreakbuf;
  int breakduration_local;
  int mode_local;
  PATHFINDERDVL *pPathfinderDVL_local;
  
  switch(mode) {
  case 0:
  default:
    if ((pPathfinderDVL->RS232Port).DevType == 0) {
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) {
        printf("Error writing data to a PathfinderDVL. \n");
        return 1;
      }
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) {
        printf("Error writing data to a PathfinderDVL. \n");
        return 1;
      }
      mSleep((long)(breakduration / 2));
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) {
        printf("Error writing data to a PathfinderDVL. \n");
        return 1;
      }
      mSleep((long)(int)((double)breakduration * 3.5));
    }
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
    break;
  case 1:
    if ((pPathfinderDVL->RS232Port).DevType == 0) {
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) {
        printf("Error writing data to a PathfinderDVL. \n");
        return 1;
      }
      mSleep((long)breakduration);
    }
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
    break;
  case 2:
    if ((pPathfinderDVL->RS232Port).DevType != 0) {
      printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
      return 1;
    }
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    mSleep((long)breakduration);
    break;
  case 3:
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
    break;
  case 4:
    if ((pPathfinderDVL->RS232Port).DevType != 0) {
      printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
      return 1;
    }
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    mSleep((long)(breakduration / 2));
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    mSleep((long)(int)((double)breakduration * 3.5));
    break;
  case 5:
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
    sVar2 = strlen("===\r");
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",(int)sVar2);
    if (iVar1 != 0) {
      printf("Error writing data to a PathfinderDVL. \n");
      return 1;
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("===\r");
      fwrite("===\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    mSleep((long)breakduration);
  }
  return 0;
}

Assistant:

inline int SendBreakPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, int mode, int breakduration)
{
	char* softbreakbuf = "===\r";

	switch(mode)
	{
	case HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case DOUBLE_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
	default:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	}

	return EXIT_SUCCESS;
}